

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CVBODrawArraysXFBPaused<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CVBODrawArraysXFBPaused<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  long lVar1;
  CVBODrawArraysXFBPaused<glcts::(anonymous_namespace)::test_api::GL> *this_local;
  
  lVar1 = CBasicXFBPausedDef::Run<glcts::(anonymous_namespace)::test_api::GL>
                    (&this->super_CBasicXFBPausedDef);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		return CBasicXFBPausedDef::Run<api>();
	}